

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::UnlockedPoolAllocator::~UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  bool bVar1;
  pointer ppVar2;
  Allocator *in_RDI;
  void *ptr;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_18;
  _Self in_stack_fffffffffffffff0;
  
  in_RDI->_vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_001db358;
  clear((UnlockedPoolAllocator *)in_stack_fffffffffffffff0._M_node);
  bVar1 = std::__cxx11::
          list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
          ::empty((list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                   *)(in_RDI + 5));
  if (!bVar1) {
    fprintf(_stderr,"FATAL ERROR! unlocked pool allocator destroyed too early\n");
    std::__cxx11::
    list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
    begin(in_stack_ffffffffffffffc8);
    while( true ) {
      local_18._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ::end(in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffff0,&local_18);
      if (!bVar1) break;
      ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                         ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x114b57);
      fprintf(_stderr,"%p still in use\n",ppVar2->second);
      std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++
                ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)&stack0xfffffffffffffff0,0);
    }
  }
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::~list
            ((list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              *)0x114ba0);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::~list
            ((list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              *)0x114bae);
  Allocator::~Allocator(in_RDI);
  return;
}

Assistant:

UnlockedPoolAllocator::~UnlockedPoolAllocator()
{
    clear();

    if (!payouts.empty())
    {
        fprintf(stderr, "FATAL ERROR! unlocked pool allocator destroyed too early\n");
        std::list< std::pair<size_t, void*> >::iterator it = payouts.begin();
        for (; it != payouts.end(); it++)
        {
            void* ptr = it->second;
            fprintf(stderr, "%p still in use\n", ptr);
        }
    }
}